

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O3

ReadFileResult
anon_unknown.dwarf_dbab10::VariableHelper
          (optional<cmCMakePresetsGraph::CacheVariable> *out,Value *value)

{
  bool bVar1;
  ReadFileResult RVar2;
  char *pcVar3;
  undefined1 local_68 [32];
  String local_48;
  
  bVar1 = Json::Value::isBool(value);
  if (bVar1) {
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"BOOL","");
    bVar1 = Json::Value::asBool(value);
    pcVar3 = "FALSE";
    if (bVar1) {
      pcVar3 = "TRUE";
    }
    local_48._M_dataplus._M_p = local_68 + 0x30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_68 + 0x20),pcVar3,pcVar3 + ((ulong)bVar1 ^ 5));
    std::optional<cmCMakePresetsGraph::CacheVariable>::operator=(out,(CacheVariable *)local_68);
    if (local_48._M_dataplus._M_p == local_68 + 0x30) goto LAB_002c6302;
  }
  else {
    bVar1 = Json::Value::isString(value);
    if (!bVar1) {
      bVar1 = Json::Value::isObject(value);
      if (bVar1) {
        if ((out->super__Optional_base<cmCMakePresetsGraph::CacheVariable,_false,_false>)._M_payload
            .super__Optional_payload<cmCMakePresetsGraph::CacheVariable,_true,_false,_false>.
            super__Optional_payload_base<cmCMakePresetsGraph::CacheVariable>._M_engaged == true) {
          std::_Optional_payload_base<cmCMakePresetsGraph::CacheVariable>::_M_destroy
                    ((_Optional_payload_base<cmCMakePresetsGraph::CacheVariable> *)out);
        }
        (out->super__Optional_base<cmCMakePresetsGraph::CacheVariable,_false,_false>)._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::CacheVariable,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::CacheVariable>._M_payload._M_value.Value.
        _M_dataplus._M_p = (pointer)0x0;
        (out->super__Optional_base<cmCMakePresetsGraph::CacheVariable,_false,_false>)._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::CacheVariable,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::CacheVariable>._M_payload._M_value.Value.
        _M_string_length = 0;
        (out->super__Optional_base<cmCMakePresetsGraph::CacheVariable,_false,_false>)._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::CacheVariable,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::CacheVariable>._M_payload._M_value.Value.
        field_2._M_allocated_capacity = 0;
        *(undefined8 *)
         ((long)&(out->super__Optional_base<cmCMakePresetsGraph::CacheVariable,_false,_false>).
                 _M_payload.
                 super__Optional_payload<cmCMakePresetsGraph::CacheVariable,_true,_false,_false>.
                 super__Optional_payload_base<cmCMakePresetsGraph::CacheVariable>._M_payload.
                 _M_value.Value.field_2 + 8) = 0;
        (out->super__Optional_base<cmCMakePresetsGraph::CacheVariable,_false,_false>)._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::CacheVariable,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::CacheVariable>._M_payload._M_value.Type.
        field_2._M_allocated_capacity = 0;
        *(undefined8 *)
         ((long)&(out->super__Optional_base<cmCMakePresetsGraph::CacheVariable,_false,_false>).
                 _M_payload.
                 super__Optional_payload<cmCMakePresetsGraph::CacheVariable,_true,_false,_false>.
                 super__Optional_payload_base<cmCMakePresetsGraph::CacheVariable>._M_payload.
                 _M_value.Type.field_2 + 8) = 0;
        (out->super__Optional_base<cmCMakePresetsGraph::CacheVariable,_false,_false>)._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::CacheVariable,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::CacheVariable>._M_payload._M_value.Type.
        _M_dataplus = (pointer)((long)&(out->
                                       super__Optional_base<cmCMakePresetsGraph::CacheVariable,_false,_false>
                                       )._M_payload.
                                       super__Optional_payload<cmCMakePresetsGraph::CacheVariable,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<cmCMakePresetsGraph::CacheVariable>
                                       ._M_payload + 0x10);
        (out->super__Optional_base<cmCMakePresetsGraph::CacheVariable,_false,_false>)._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::CacheVariable,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::CacheVariable>._M_payload._M_value.Type.
        _M_string_length = 0;
        (out->super__Optional_base<cmCMakePresetsGraph::CacheVariable,_false,_false>)._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::CacheVariable,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::CacheVariable>._M_payload._M_value.Value.
        _M_dataplus._M_p =
             (pointer)((long)&(out->
                              super__Optional_base<cmCMakePresetsGraph::CacheVariable,_false,_false>
                              )._M_payload.
                              super__Optional_payload<cmCMakePresetsGraph::CacheVariable,_true,_false,_false>
                              .super__Optional_payload_base<cmCMakePresetsGraph::CacheVariable>.
                              _M_payload + 0x30);
        (out->super__Optional_base<cmCMakePresetsGraph::CacheVariable,_false,_false>)._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::CacheVariable,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::CacheVariable>._M_engaged = true;
        RVar2 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
                Object<cmCMakePresetsGraph::CacheVariable>::operator()
                          ((Object<cmCMakePresetsGraph::CacheVariable> *)
                           (anonymous_namespace)::VariableObjectHelper,(CacheVariable *)out,value);
        return RVar2;
      }
      bVar1 = Json::Value::isNull(value);
      if (!bVar1) {
        return INVALID_VARIABLE;
      }
      if ((out->super__Optional_base<cmCMakePresetsGraph::CacheVariable,_false,_false>)._M_payload.
          super__Optional_payload<cmCMakePresetsGraph::CacheVariable,_true,_false,_false>.
          super__Optional_payload_base<cmCMakePresetsGraph::CacheVariable>._M_engaged != true) {
        return READ_OK;
      }
      std::_Optional_payload_base<cmCMakePresetsGraph::CacheVariable>::_M_destroy
                ((_Optional_payload_base<cmCMakePresetsGraph::CacheVariable> *)out);
      return READ_OK;
    }
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"");
    Json::Value::asString_abi_cxx11_((String *)(local_68 + 0x20),value);
    std::optional<cmCMakePresetsGraph::CacheVariable>::operator=(out,(CacheVariable *)local_68);
    if (local_48._M_dataplus._M_p == local_68 + 0x30) goto LAB_002c6302;
  }
  operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
LAB_002c6302:
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  return READ_OK;
}

Assistant:

ReadFileResult VariableHelper(cm::optional<CacheVariable>& out,
                              const Json::Value* value)
{
  if (value->isBool()) {
    out = CacheVariable{
      /*Type=*/"BOOL",
      /*Value=*/value->asBool() ? "TRUE" : "FALSE",
    };
    return ReadFileResult::READ_OK;
  }
  if (value->isString()) {
    out = CacheVariable{
      /*Type=*/"",
      /*Value=*/value->asString(),
    };
    return ReadFileResult::READ_OK;
  }
  if (value->isObject()) {
    out.emplace();
    return VariableObjectHelper(*out, value);
  }
  if (value->isNull()) {
    out = cm::nullopt;
    return ReadFileResult::READ_OK;
  }
  return ReadFileResult::INVALID_VARIABLE;
}